

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O2

void print_block(Block *b,ProxyWithLink *cp,bool verbose)

{
  RegularLink<diy::Bounds<float>_> *this;
  float *pfVar1;
  float *pfVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pSVar5;
  pointer piVar6;
  pointer args_2;
  long lVar7;
  long lVar8;
  int i_00;
  long lVar9;
  size_t i;
  ulong uVar10;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_f0;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_b0;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_70;
  
  this = (RegularLink<diy::Bounds<float>_> *)cp->link_;
  local_b0._0_4_ = (cp->super_Proxy).gid_;
  pfVar1 = (this->bounds_).min.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
  pfVar2 = (this->bounds_).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
  local_f0._0_4_ =
       SUB84((ulong)((long)(this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).
                           super_Link.neighbors_.
                           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link
                          .neighbors_.
                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3,0);
  local_70._0_8_ =
       (long)(b->points).super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(b->points).super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  fmt::v7::print<char[55],int,float&,float&,float&,float&,float&,float&,int,unsigned_long,char>
            ((char (*) [55])"{}: [{},{},{}] - [{},{},{}] ({} neighbors): {} points\n",
             (int *)&local_b0,pfVar1,pfVar1 + 1,pfVar1 + 2,pfVar2,pfVar2 + 1,pfVar2 + 2,
             (int *)&local_f0,(unsigned_long *)&local_70);
  lVar7 = 9;
  lVar8 = 4;
  lVar9 = 0;
  while( true ) {
    pBVar3 = (this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.neighbors_.
             super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).
                            super_Link.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pBVar3) >> 3) <= lVar9) break;
    i_00 = (int)lVar9;
    diy::RegularLink<diy::Bounds<float>_>::direction((Direction *)&local_70,this,i_00);
    args_2 = local_70.m_begin;
    diy::RegularLink<diy::Bounds<float>_>::direction((Direction *)&local_b0,this,i_00);
    piVar6 = local_b0.m_begin;
    diy::RegularLink<diy::Bounds<float>_>::direction((Direction *)&local_f0,this,i_00);
    fmt::v7::print<char[22],int&,int&,int&,int&,int&,char>
              ((char (*) [22])"  ({},{},({},{},{})):",(int *)((long)pBVar3 + lVar8 + -4),
               (int *)((long)&pBVar3->gid + lVar8),args_2,piVar6 + 1,local_f0.m_begin + 2);
    itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_f0);
    itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_b0);
    itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_70);
    pBVar4 = (this->nbr_bounds_).
             super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar1 = *(float **)((long)(&pBVar4->min + -1) + lVar7 * 8);
    pfVar2 = *(float **)
              ((long)(pBVar4->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.
                     m_static_data + lVar7 * 8 + 0xffffffffffffffe0U);
    fmt::v7::
    print<char[26],float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,char>
              ((char (*) [26])0x137534,pfVar1,pfVar1 + 1,pfVar1 + 2,pfVar2,pfVar2 + 1,pfVar2 + 2);
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + 0x10;
    lVar8 = lVar8 + 8;
  }
  if (verbose) {
    lVar7 = 8;
    for (uVar10 = 0;
        pSVar5 = (b->points).super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)(b->points).
                               super__Vector_base<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 3);
        uVar10 = uVar10 + 1) {
      fmt::v7::print<char[12],float&,float&,float&,char>
                ((char (*) [12])"  {} {} {}\n",(float *)((long)pSVar5[-1].coords + lVar7),
                 (float *)((long)pSVar5->coords + lVar7 + -4),
                 (float *)((long)pSVar5->coords + lVar7));
      lVar7 = lVar7 + 8;
    }
  }
  return;
}

Assistant:

void print_block(Block* b, const diy::Master::ProxyWithLink& cp, bool verbose)
{
  RCLink*  link      = static_cast<RCLink*>(cp.link());

  fmt::print("{}: [{},{},{}] - [{},{},{}] ({} neighbors): {} points\n",
                  cp.gid(),
                  link->bounds().min[0], link->bounds().min[1], link->bounds().min[2],
                  link->bounds().max[0], link->bounds().max[1], link->bounds().max[2],
                  link->size(), b->points.size());

  for (int i = 0; i < link->size(); ++i)
  {
      fmt::print("  ({},{},({},{},{})):",
                      link->target(i).gid, link->target(i).proc,
                      link->direction(i)[0],
                      link->direction(i)[1],
                      link->direction(i)[2]);
      const Bounds& bounds = link->bounds(i);
      fmt::print(" [{},{},{}] - [{},{},{}]\n",
              bounds.min[0], bounds.min[1], bounds.min[2],
              bounds.max[0], bounds.max[1], bounds.max[2]);
  }

  if (verbose)
    for (size_t i = 0; i < b->points.size(); ++i)
      fmt::print("  {} {} {}\n", b->points[i][0], b->points[i][1], b->points[i][2]);
}